

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl.h
# Opt level: O0

bool __thiscall
pybind11::detail::
list_caster<std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>,_std::pair<long,_long>_>
::load(list_caster<std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>,_std::pair<long,_long>_>
       *this,handle src,bool convert)

{
  handle src_00;
  bool bVar1;
  byte bVar2;
  value_type *in_RDI;
  template_cast_op_type<typename_std::add_rvalue_reference<pair<long,_long>_&&>::type> tVar3;
  value_conv conv;
  reference it;
  sequence_iterator __end3;
  sequence_iterator __begin3;
  sequence *__range3;
  sequence s;
  value_type *in_stack_fffffffffffffed8;
  handle in_stack_fffffffffffffee0;
  handle in_stack_fffffffffffffee8;
  undefined5 in_stack_fffffffffffffef0;
  undefined1 in_stack_fffffffffffffef5;
  undefined1 in_stack_fffffffffffffef6;
  undefined1 in_stack_fffffffffffffef7;
  long in_stack_ffffffffffffff28;
  long in_stack_ffffffffffffff30;
  template_cast_op_type<typename_std::add_rvalue_reference<pair<long,_long>_&&>::type> tVar4;
  undefined4 in_stack_ffffffffffffff38;
  uint in_stack_ffffffffffffff3c;
  byte local_1;
  
  bVar1 = isinstance<pybind11::sequence,_0>(in_stack_fffffffffffffee0);
  if ((!bVar1) || (bVar1 = isinstance<pybind11::str,_0>(in_stack_fffffffffffffee0), bVar1)) {
    local_1 = 0;
  }
  else {
    reinterpret_borrow<pybind11::sequence>(in_stack_fffffffffffffee8);
    std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::clear
              ((vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)0x390906);
    sequence::sequence((sequence *)in_stack_fffffffffffffee0.m_ptr,
                       (sequence *)in_stack_fffffffffffffed8);
    reserve_maybe<std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>,_0>
              ((list_caster<std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>,_std::pair<long,_long>_>
                *)CONCAT17(in_stack_fffffffffffffef7,
                           CONCAT16(in_stack_fffffffffffffef6,
                                    CONCAT15(in_stack_fffffffffffffef5,in_stack_fffffffffffffef0))),
               (sequence *)in_stack_fffffffffffffee8.m_ptr,
               (vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)
               in_stack_fffffffffffffee0.m_ptr);
    sequence::~sequence((sequence *)0x39093e);
    sequence::begin((sequence *)in_stack_fffffffffffffee0.m_ptr);
    sequence::end((sequence *)in_stack_fffffffffffffee0.m_ptr);
    tVar4.second = in_stack_ffffffffffffff30;
    tVar4.first = in_stack_ffffffffffffff28;
    tVar3.second = (long)in_stack_fffffffffffffee0.m_ptr;
    tVar3.first = (long)in_stack_fffffffffffffee8.m_ptr;
    while (bVar1 = detail::operator!=((It *)tVar3.second,(It *)in_stack_fffffffffffffed8), bVar1) {
      generic_iterator<pybind11::detail::iterator_policies::sequence_slow_readwrite>::operator*
                ((generic_iterator<pybind11::detail::iterator_policies::sequence_slow_readwrite> *)
                 in_stack_fffffffffffffed8);
      type_caster<std::pair<long,_long>,_void>::type_caster
                ((type_caster<std::pair<long,_long>,_void> *)0x3909fd);
      accessor::operator_cast_to_object
                ((accessor<pybind11::detail::accessor_policies::sequence_item> *)tVar3.first);
      src_00.m_ptr._4_4_ = in_stack_ffffffffffffff3c;
      src_00.m_ptr._0_4_ = in_stack_ffffffffffffff38;
      bVar1 = tuple_caster<std::pair,_long,_long>::load
                        ((tuple_caster<std::pair,_long,_long> *)tVar4.second,src_00,
                         tVar4.first._7_1_);
      bVar2 = bVar1 ^ 0xff;
      object::~object((object *)0x390a51);
      bVar1 = (bVar2 & 1) != 0;
      if (bVar1) {
        local_1 = 0;
      }
      else {
        in_stack_fffffffffffffed8 = in_RDI;
        tVar3 = cast_op<std::pair<long,long>&&>((make_caster<std::pair<long,_long>_&&> *)0x390afe);
        tVar4 = tVar3;
        std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::push_back
                  ((vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)
                   tVar3.second,in_stack_fffffffffffffed8);
      }
      in_stack_ffffffffffffff3c = (uint)bVar1;
      accessor<pybind11::detail::accessor_policies::sequence_item>::~accessor
                ((accessor<pybind11::detail::accessor_policies::sequence_item> *)0x390b43);
      if (in_stack_ffffffffffffff3c != 0) goto LAB_00390b82;
      generic_iterator<pybind11::detail::iterator_policies::sequence_slow_readwrite>::operator++
                ((generic_iterator<pybind11::detail::iterator_policies::sequence_slow_readwrite> *)
                 tVar3.second);
    }
    local_1 = 1;
LAB_00390b82:
    sequence::~sequence((sequence *)0x390b8f);
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool load(handle src, bool convert) {
        if (!isinstance<sequence>(src) || isinstance<str>(src))
            return false;
        auto s = reinterpret_borrow<sequence>(src);
        value.clear();
        reserve_maybe(s, &value);
        for (auto it : s) {
            value_conv conv;
            if (!conv.load(it, convert))
                return false;
            value.push_back(cast_op<Value &&>(std::move(conv)));
        }
        return true;
    }